

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * CMU462::operator*(Matrix3x3 *__return_storage_ptr__,double c,Matrix3x3 *A)

{
  double *cAij;
  double *Aij;
  Matrix3x3 *A_local;
  double c_local;
  Matrix3x3 *cA;
  
  Matrix3x3::Matrix3x3(__return_storage_ptr__);
  __return_storage_ptr__->entries[0].x = c * A->entries[0].x;
  __return_storage_ptr__->entries[0].y = c * A->entries[0].y;
  __return_storage_ptr__->entries[0].z = c * A->entries[0].z;
  __return_storage_ptr__->entries[1].x = c * A->entries[1].x;
  __return_storage_ptr__->entries[1].y = c * A->entries[1].y;
  __return_storage_ptr__->entries[1].z = c * A->entries[1].z;
  __return_storage_ptr__->entries[2].x = c * A->entries[2].x;
  __return_storage_ptr__->entries[2].y = c * A->entries[2].y;
  __return_storage_ptr__->entries[2].z = c * A->entries[2].z;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 operator*( double c, const Matrix3x3& A ) {

    Matrix3x3 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);

    return cA;
  }